

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

void __thiscall
duckdb::BindContext::AddEntryBinding
          (BindContext *this,idx_t index,string *alias,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,StandardEntry *entry)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_28;
  Binding *local_20;
  idx_t local_18;
  
  local_18 = index;
  make_uniq<duckdb::EntryBinding,std::__cxx11::string_const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<std::__cxx11::string,true>const&,unsigned_long&,duckdb::StandardEntry&>
            ((duckdb *)&local_20,alias,types,names,&local_18,entry);
  local_28._M_head_impl = local_20;
  local_20 = (Binding *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
              *)&this->bindings_list,
             (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)&local_28);
  if (local_28._M_head_impl != (Binding *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Binding[1])();
  }
  local_28._M_head_impl = (Binding *)0x0;
  if (local_20 != (Binding *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return;
}

Assistant:

void BindContext::AddEntryBinding(idx_t index, const string &alias, const vector<string> &names,
                                  const vector<LogicalType> &types, StandardEntry &entry) {
	AddBinding(make_uniq<EntryBinding>(alias, types, names, index, entry));
}